

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollwrap.c
# Opt level: O0

void pollwrap_add_fd_events(pollwrapper *pw,int fd,int events)

{
  size_t sVar1;
  pollfd *ppVar2;
  void *pvVar3;
  pollwrap_fdtopos *added;
  size_t index;
  pollwrap_fdtopos f2p_find;
  pollwrap_fdtopos *f2p;
  int events_local;
  int fd_local;
  pollwrapper *pw_local;
  
  if (fd < 0) {
    __assert_fail("fd >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/utils/pollwrap.c"
                  ,0x4f,"void pollwrap_add_fd_events(pollwrapper *, int, int)");
  }
  index._0_4_ = fd;
  f2p_find.pos = (size_t)find234(pw->fdtopos,&index,(cmpfn234)0x0);
  if ((void *)f2p_find.pos == (void *)0x0) {
    ppVar2 = (pollfd *)safegrowarray(pw->fds,&pw->fdsize,8,pw->nfd,1,false);
    pw->fds = ppVar2;
    sVar1 = pw->nfd;
    pw->nfd = sVar1 + 1;
    pw->fds[sVar1].fd = fd;
    pw->fds[sVar1].revents = 0;
    pw->fds[sVar1].events = 0;
    f2p_find.pos = (size_t)safemalloc(1,0x10,0);
    *(int *)f2p_find.pos = fd;
    *(size_t *)(f2p_find.pos + 8) = sVar1;
    pvVar3 = add234(pw->fdtopos,(void *)f2p_find.pos);
    if (pvVar3 != (void *)f2p_find.pos) {
      __assert_fail("added == f2p",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/utils/pollwrap.c"
                    ,0x5d,"void pollwrap_add_fd_events(pollwrapper *, int, int)");
    }
  }
  pw->fds[*(long *)(f2p_find.pos + 8)].events =
       pw->fds[*(long *)(f2p_find.pos + 8)].events | (ushort)events;
  return;
}

Assistant:

void pollwrap_add_fd_events(pollwrapper *pw, int fd, int events)
{
    pollwrap_fdtopos *f2p, f2p_find;

    assert(fd >= 0);

    f2p_find.fd = fd;
    f2p = find234(pw->fdtopos, &f2p_find, NULL);
    if (!f2p) {
        sgrowarray(pw->fds, pw->fdsize, pw->nfd);
        size_t index = pw->nfd++;
        pw->fds[index].fd = fd;
        pw->fds[index].events = pw->fds[index].revents = 0;

        f2p = snew(pollwrap_fdtopos);
        f2p->fd = fd;
        f2p->pos = index;
        pollwrap_fdtopos *added = add234(pw->fdtopos, f2p);
        assert(added == f2p);
    }

    pw->fds[f2p->pos].events |= events;
}